

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O1

int __thiscall
luna::Function::AddUpvalue(Function *this,String *name,bool parent_local,int register_index)

{
  pointer *ppUVar1;
  iterator __position;
  UpvalueInfo local_18;
  
  local_18.parent_local_ = parent_local;
  __position._M_current =
       (this->upvalues_).
       super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->upvalues_).
      super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_18.name_ = name;
    local_18.register_index_ = register_index;
    std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>::
    _M_realloc_insert<luna::Function::UpvalueInfo>(&this->upvalues_,__position,&local_18);
  }
  else {
    (__position._M_current)->name_ = name;
    (__position._M_current)->parent_local_ = parent_local;
    *(undefined3 *)&(__position._M_current)->field_0x9 = local_18._9_3_;
    (__position._M_current)->register_index_ = register_index;
    ppUVar1 = &(this->upvalues_).
               super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppUVar1 = *ppUVar1 + 1;
  }
  return (int)((ulong)((long)(this->upvalues_).
                             super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->upvalues_).
                            super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
}

Assistant:

int Function::AddUpvalue(String *name, bool parent_local, int register_index)
    {
        upvalues_.push_back(UpvalueInfo(name, parent_local, register_index));
        return upvalues_.size() - 1;
    }